

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ParseLiteralNoAST
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,EncodedChar *input,
          EncodedChar *inputLim,CharCount *outBodyEncodedChars,CharCount *outTotalEncodedChars,
          CharCount *outBodyChars,CharCount *outTotalChars)

{
  code *pcVar1;
  CharCount CVar2;
  HRESULT HVar3;
  bool bVar4;
  CharCount CVar5;
  undefined4 *puVar6;
  ParseError *pPVar7;
  RegexFlags local_31 [8];
  RegexFlags dummyFlags;
  
  if (input == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb7c,"(input != 0)","input != 0");
    if (!bVar4) goto LAB_00d3907f;
    *puVar6 = 0;
  }
  if (inputLim < input) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb7d,"(inputLim >= input)","inputLim >= input");
    if (!bVar4) {
LAB_00d3907f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  this->input = input;
  this->inputLim = inputLim;
  this->next = input;
  this->inBody = true;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
  PatternPass0(this);
  CVar5 = Chars<unsigned_char>::OSB(this->next,input);
  *outBodyEncodedChars = CVar5;
  CVar5 = Pos(this);
  *outBodyChars = CVar5;
  ECMust(this,'/',-0x7ff5fc0c);
  local_31[0] = NoRegexFlags;
  Options(this,local_31);
  this->unicodeFlagPresent = (bool)(local_31[0] >> 3 & 1);
  this->caseInsensitiveFlagPresent = (bool)(local_31[0] & IgnoreCaseRegexFlag);
  this->dotAllFlagPresent = (bool)(local_31[0] >> 5 & 1);
  CVar5 = Chars<unsigned_char>::OSB(this->next,input);
  *outTotalEncodedChars = CVar5;
  CVar5 = Pos(this);
  *outTotalChars = CVar5;
  if ((this->deferredIfNotUnicodeError == (ParseError *)0x0) || (this->unicodeFlagPresent != false))
  {
    if ((this->deferredIfUnicodeError == (ParseError *)0x0) || (this->unicodeFlagPresent != true)) {
      return;
    }
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar7 = this->deferredIfUnicodeError;
  }
  else {
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar7 = this->deferredIfNotUnicodeError;
  }
  CVar5 = pPVar7->pos;
  CVar2 = pPVar7->encodedPos;
  HVar3 = pPVar7->error;
  *puVar6 = *(undefined4 *)pPVar7;
  puVar6[1] = CVar5;
  puVar6[2] = CVar2;
  puVar6[3] = HVar3;
  __cxa_throw(puVar6,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::ParseLiteralNoAST
        ( const EncodedChar* input
        , const EncodedChar* inputLim
        , CharCount& outBodyEncodedChars
        , CharCount& outTotalEncodedChars
        , CharCount& outBodyChars
        , CharCount& outTotalChars )
    {
        Assert(IsLiteral);
        Assert(input != 0);
        Assert(inputLim >= input); // *inputLim need not be 0 because of deferred parsing

        // Body, pass 0
        SetPosition(input, inputLim, true);
        PatternPass0();
        outBodyEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outBodyChars = Pos();

        // Options
        ECMust('/', ERRnoSlash);
        RegexFlags dummyFlags = NoRegexFlags;
        Options(dummyFlags);
        this->unicodeFlagPresent = (dummyFlags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
        this->caseInsensitiveFlagPresent = (dummyFlags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
        this->dotAllFlagPresent = (dummyFlags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
        outTotalEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outTotalChars = Pos();

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }
    }